

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# haxx_quaternion_op.hpp
# Opt level: O2

quaternion<double> *
HAXX::operator*(quaternion<double> *__return_storage_ptr__,quaternion<double> *__x,
               quaternion<double> *__y)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  __m256d y;
  __m256d x;
  double local_80;
  double dStack_78;
  double dStack_70;
  double dStack_68;
  double local_60;
  double dStack_58;
  double dStack_50;
  double dStack_48;
  
  local_60 = __x->_M_real;
  dStack_58 = __x->_M_imag_i;
  dStack_50 = __x->_M_imag_j;
  dStack_48 = __x->_M_imag_k;
  dVar1 = __y->_M_real;
  dVar2 = __y->_M_imag_i;
  dVar3 = __y->_M_imag_j;
  dVar4 = __y->_M_imag_k;
  local_80 = dVar1;
  dStack_78 = dVar2;
  dStack_70 = dVar3;
  dStack_68 = dVar4;
  MULDQ_NN((__m256d *)&local_60,(__m256d *)&local_80);
  __return_storage_ptr__->_M_real = dVar1;
  __return_storage_ptr__->_M_imag_i = dVar2;
  __return_storage_ptr__->_M_imag_j = dVar3;
  __return_storage_ptr__->_M_imag_k = dVar4;
  return __return_storage_ptr__;
}

Assistant:

inline quaternion<double> operator*(const quaternion<double>& __x,
    const quaternion<double>& __y) {
  
    quaternion<double> __r;
  
    // Load x,y into 256-bit vector lanes and perform the multiplication
    __m256d x = LOAD_256D_UNALIGNED_AS(double,&__x);
    __m256d y = LOAD_256D_UNALIGNED_AS(double,&__y);
    __m256d r = MULDQ_NN(x,y);
  
    STORE_256D_UNALIGNED_AS(double,&__r,r);
    
    return __r;
  }